

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelSizeCase::checkTextureState
          (TextureLevelSizeCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  int level;
  bool bVar1;
  int refValue_00;
  size_type sVar2;
  const_reference pvVar3;
  int refValue;
  int queryLevel;
  int levelNdx;
  bool allOk;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelSizeCase *this_local;
  
  queryLevel._3_1_ = true;
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    queryLevel._3_1_ =
         verifyTextureLevelParameterEqual
                   (gl,spec->queryTarget,0,this->m_pname,0,(this->super_TextureLevelCase).m_type);
  }
  else {
    for (refValue = 0;
        sVar2 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ::size(&spec->levels), refValue < (int)sVar2; refValue = refValue + 1) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue);
      level = pvVar3->level;
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue);
      refValue_00 = getMinimumComponentResolution(this,pvVar3->internalFormat);
      bVar1 = verifyTextureLevelParameterGreaterOrEqual
                        (gl,spec->queryTarget,level,this->m_pname,refValue_00,
                         (this->super_TextureLevelCase).m_type);
      queryLevel._3_1_ = (queryLevel._3_1_ & bVar1) != 0;
    }
  }
  return queryLevel._3_1_;
}

Assistant:

bool TextureLevelSizeCase::checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
{
	bool allOk = true;

	if (spec.levels.empty())
	{
		allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, m_pname, 0, m_type);
	}
	else
	{
		for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
		{
			const int queryLevel	= spec.levels[levelNdx].level;
			const int refValue		= getMinimumComponentResolution(spec.levels[levelNdx].internalFormat);

			allOk &= verifyTextureLevelParameterGreaterOrEqual(gl, spec.queryTarget, queryLevel, m_pname, refValue, m_type);
		}
	}

	return allOk;
}